

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<long_long,fmt::v6::basic_format_specs<char>>::dec_writer>
::operator()(padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<long_long,fmt::v6::basic_format_specs<char>>::dec_writer>
             *this,char **it)

{
  int iVar1;
  char *__s;
  bool bVar2;
  long lVar3;
  undefined1 *puVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  ptrdiff_t _Num;
  char *pcVar8;
  ptrdiff_t _Num_1;
  size_t sVar9;
  char buffer [40];
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  
  sVar9 = *(size_t *)(this + 0x10);
  if (sVar9 != 0) {
    pcVar8 = *it;
    memmove(pcVar8,*(void **)(this + 8),sVar9);
    *it = pcVar8 + sVar9;
  }
  __s = *it;
  sVar9 = *(size_t *)(this + 0x20);
  pcVar8 = __s;
  if (sVar9 != 0) {
    pcVar8 = __s + sVar9;
    memset(__s,*(int *)(this + 0x18),sVar9);
  }
  *it = pcVar8;
  iVar1 = *(int *)(this + 0x30);
  sVar9 = (size_t)iVar1;
  if ((long)sVar9 < 0) {
    assert_fail(in_stack_ffffffffffffffc0,0,in_stack_ffffffffffffffb8);
  }
  uVar6 = *(ulong *)(this + 0x28);
  puVar4 = &stack0xffffffffffffffb8 + sVar9;
  uVar7 = uVar6;
  if (99 < uVar6) {
    do {
      uVar6 = uVar7 / 100;
      *(undefined2 *)(puVar4 + -2) =
           *(undefined2 *)
            (basic_data<void>::digits + (ulong)(uint)((int)uVar7 + (int)uVar6 * -100) * 2);
      puVar4 = puVar4 + -2;
      bVar2 = 9999 < uVar7;
      uVar7 = uVar6;
    } while (bVar2);
  }
  if (uVar6 < 10) {
    bVar5 = (byte)uVar6 | 0x30;
    lVar3 = -1;
  }
  else {
    puVar4[-1] = basic_data<void>::digits[(uVar6 * 2 & 0xffffffff) + 1];
    bVar5 = basic_data<void>::digits[uVar6 * 2 & 0x1fffffffe];
    lVar3 = -2;
  }
  puVar4[lVar3] = bVar5;
  if (iVar1 != 0) {
    memcpy(pcVar8,&stack0xffffffffffffffb8,sVar9);
  }
  *it = pcVar8 + sVar9;
  return;
}

Assistant:

void operator()(It&& it) const {
      if (prefix.size() != 0)
        it = copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }